

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O1

int map_bucket_realloc_iterator(map m,map_key key,map_value value,map_cb_iterate_args args)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = 1;
  if (((args != (map_cb_iterate_args)0x0) && (key != (map_key)0x0)) && ((map)args != m)) {
    uVar2 = (**(code **)((long)args + 0x20))(key);
    iVar1 = bucket_insert((bucket)((uVar2 % *(ulong *)((long)args + 8)) * 0x18 +
                                  *(long *)((long)args + 0x18)),key,value);
    if (iVar1 == 0) {
      *(long *)args = *args + 1;
      iVar3 = 0;
    }
    else {
      log_write_impl_va("metacall",0x79,"map_bucket_realloc_iterator",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                        ,3,"Invalid map bucket realloc insertion");
    }
  }
  return iVar3;
}

Assistant:

static int map_bucket_realloc_iterator(map m, map_key key, map_value value, map_cb_iterate_args args)
{
	map new_map = (map)args;

	if (new_map != m && key != NULL && args != NULL)
	{
		map_hash h = new_map->hash_cb(key);

		size_t index = h % new_map->capacity;

		bucket b = &new_map->buckets[index];

		if (bucket_insert(b, key, value) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket realloc insertion");
			return 1;
		}

		++new_map->count;

		return 0;
	}

	return 1;
}